

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugScreen.cpp
# Opt level: O0

void __thiscall DebugScreen::draw(DebugScreen *this,RenderTarget *target,RenderStates states)

{
  int iVar1;
  RenderStates *pRVar2;
  bool bVar3;
  int *piVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  size_type sVar7;
  Vector2f *pVVar8;
  float *pfVar9;
  Text *in_RSI;
  RenderStates *in_RDI;
  float fVar10;
  float scale;
  float scaleY;
  float scaleX;
  Sprite sprite;
  NamedTexture *namedTex;
  Text textureField;
  value_type *custom;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Text,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Text>_>_>
  *__range2_1;
  Text *field;
  const_iterator __end2;
  const_iterator __begin2;
  vector<sf::Text,_std::allocator<sf::Text>_> *__range2;
  Vector2i clippedSize;
  Vector2f *in_stack_fffffffffffffa78;
  Text *in_stack_fffffffffffffa80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa88;
  Texture *in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  string *in_stack_fffffffffffffac8;
  String *in_stack_fffffffffffffad0;
  Transformable *this_00;
  undefined4 in_stack_fffffffffffffb58;
  float in_stack_fffffffffffffb5c;
  Vector2u in_stack_fffffffffffffb60;
  float local_498;
  Vector2u local_494;
  float local_48c [3];
  Transformable local_480;
  locale local_368 [8];
  Vector2u local_360;
  string local_358 [32];
  Vector2u local_338;
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [64];
  const_reference local_230;
  Vector2<float> local_224;
  Vector2<float> local_21c;
  locale local_208 [48];
  Transformable local_1d8 [2];
  reference local_70;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Text>,_true>
  local_68;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Text>,_true>
  local_60;
  Shader **local_58;
  reference local_50;
  Text *local_48;
  __normal_iterator<const_sf::Text_*,_std::vector<sf::Text,_std::allocator<sf::Text>_>_> local_40;
  float *local_38;
  Vector2<float> local_30;
  int local_28;
  int local_24 [3];
  Vector2<int> local_18;
  Text *local_10;
  
  if (((in_RDI->blendMode).alphaEquation & Subtract) != Add) {
    local_24[2] = ((int)(in_RDI->transform).m_matrix[3] - (int)(in_RDI->transform).m_matrix[5]) -
                  (int)(in_RDI->transform).m_matrix[7];
    local_24[1] = 0;
    local_10 = in_RSI;
    piVar4 = std::max<int>(local_24 + 2,local_24 + 1);
    iVar1 = *piVar4;
    local_24[0] = ((int)(in_RDI->transform).m_matrix[4] - (int)(in_RDI->transform).m_matrix[6]) -
                  (int)(in_RDI->transform).m_matrix[8];
    local_28 = 0;
    piVar4 = std::max<int>(local_24,&local_28);
    sf::Vector2<int>::Vector2(&local_18,iVar1,*piVar4);
    sf::Vector2<float>::Vector2<int>(&local_30,(Vector2<int> *)((in_RDI->transform).m_matrix + 5));
    sf::Transform::translate((Transform *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    if ((in_RDI->blendMode).colorEquation == Add) {
      local_38 = (in_RDI->transform).m_matrix + 0xc;
      local_40._M_current =
           (Text *)std::vector<sf::Text,_std::allocator<sf::Text>_>::begin
                             ((vector<sf::Text,_std::allocator<sf::Text>_> *)
                              in_stack_fffffffffffffa78);
      local_48 = (Text *)std::vector<sf::Text,_std::allocator<sf::Text>_>::end
                                   ((vector<sf::Text,_std::allocator<sf::Text>_> *)
                                    in_stack_fffffffffffffa78);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_sf::Text_*,_std::vector<sf::Text,_std::allocator<sf::Text>_>_>
                                 *)in_stack_fffffffffffffa80,
                                (__normal_iterator<const_sf::Text_*,_std::vector<sf::Text,_std::allocator<sf::Text>_>_>
                                 *)in_stack_fffffffffffffa78), bVar3) {
        local_50 = __gnu_cxx::
                   __normal_iterator<const_sf::Text_*,_std::vector<sf::Text,_std::allocator<sf::Text>_>_>
                   ::operator*(&local_40);
        sf::RenderTarget::draw
                  ((RenderTarget *)in_stack_fffffffffffffb60,
                   (Drawable *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),in_RDI)
        ;
        __gnu_cxx::
        __normal_iterator<const_sf::Text_*,_std::vector<sf::Text,_std::allocator<sf::Text>_>_>::
        operator++(&local_40);
      }
      local_58 = &in_RDI->shader;
      local_60._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Text,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Text>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Text,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Text>_>_>
                    *)in_stack_fffffffffffffa78);
      local_68._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Text,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Text>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Text,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Text>_>_>
                  *)in_stack_fffffffffffffa78);
      while (bVar3 = std::__detail::operator!=(&local_60,&local_68), bVar3) {
        local_70 = std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Text>,_false,_true>
                   ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Text>,_false,_true>
                                *)0x185115);
        sf::RenderTarget::draw
                  ((RenderTarget *)in_stack_fffffffffffffb60,
                   (Drawable *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),in_RDI)
        ;
        std::__detail::
        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Text>,_false,_true>
        ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Text>,_false,_true>
                      *)in_stack_fffffffffffffa80);
      }
    }
    else if ((in_RDI->blendMode).colorEquation == Subtract) {
      std::locale::locale(local_208);
      sf::String::String(in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8,
                         (locale *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
      sf::Text::Text((Text *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                     (String *)in_stack_fffffffffffffab8,
                     (Font *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                     (uint)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
      sf::String::~String((String *)0x1851ca);
      std::locale::~locale(local_208);
      pvVar5 = std::vector<sf::Text,_std::allocator<sf::Text>_>::operator[]
                         ((vector<sf::Text,_std::allocator<sf::Text>_> *)
                          ((in_RDI->transform).m_matrix + 0xc),0);
      sf::Transformable::getPosition(&pvVar5->super_Transformable);
      sf::Vector2<float>::Vector2(&local_224,0.0,(float)(uint)(in_RDI->transform).m_matrix[2]);
      local_21c = sf::operator+(in_stack_fffffffffffffa78,(Vector2<float> *)0x185249);
      sf::Transformable::setPosition
                ((Transformable *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      pvVar6 = std::array<int,_2UL>::operator[]
                         ((array<int,_2UL> *)in_stack_fffffffffffffa80,
                          (size_type)in_stack_fffffffffffffa78);
      if (-1 < *pvVar6) {
        pvVar6 = std::array<int,_2UL>::operator[]
                           ((array<int,_2UL> *)in_stack_fffffffffffffa80,
                            (size_type)in_stack_fffffffffffffa78);
        iVar1 = *pvVar6;
        sVar7 = std::vector<DebugScreen::NamedTexture,_std::allocator<DebugScreen::NamedTexture>_>::
                size((vector<DebugScreen::NamedTexture,_std::allocator<DebugScreen::NamedTexture>_>
                      *)(in_RDI[1].transform.m_matrix + 6));
        if (iVar1 < (int)sVar7) {
          pRVar2 = in_RDI + 1;
          pvVar6 = std::array<int,_2UL>::operator[]
                             ((array<int,_2UL> *)in_stack_fffffffffffffa80,
                              (size_type)in_stack_fffffffffffffa78);
          local_230 = std::
                      vector<DebugScreen::NamedTexture,_std::allocator<DebugScreen::NamedTexture>_>
                      ::operator[]((vector<DebugScreen::NamedTexture,_std::allocator<DebugScreen::NamedTexture>_>
                                    *)((pRVar2->transform).m_matrix + 6),(long)*pvVar6);
          std::operator+((char *)in_stack_fffffffffffffac8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
          std::operator+(in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80);
          local_338 = sf::Texture::getSize(local_230->texture);
          std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
          std::operator+(in_stack_fffffffffffffab8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
          std::operator+(in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80);
          local_360 = sf::Texture::getSize(local_230->texture);
          std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
          std::operator+(in_stack_fffffffffffffab8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
          std::operator+(in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80);
          std::locale::locale(local_368);
          sf::String::String(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                             (locale *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0)
                            );
          sf::Text::setString(in_stack_fffffffffffffa80,(String *)in_stack_fffffffffffffa78);
          sf::String::~String((String *)0x1854a3);
          std::locale::~locale(local_368);
          std::__cxx11::string::~string(local_270);
          std::__cxx11::string::~string(local_290);
          std::__cxx11::string::~string(local_358);
          std::__cxx11::string::~string(local_2b0);
          std::__cxx11::string::~string(local_2d0);
          std::__cxx11::string::~string(local_330);
          std::__cxx11::string::~string(local_2f0);
          std::__cxx11::string::~string(local_310);
          sf::Sprite::Sprite((Sprite *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)
                             ,in_stack_fffffffffffffaa8);
          this_00 = &local_480;
          pVVar8 = sf::Transformable::getPosition(local_1d8);
          sf::Transformable::setPosition
                    (this_00,0.0,(float)(uint)(in_RDI->transform).m_matrix[2] + pVVar8->y + 4.0);
          fVar10 = (float)local_18.x;
          pVVar8 = sf::Transformable::getPosition(&local_480);
          fVar10 = fVar10 - pVVar8->x;
          local_494 = sf::Texture::getSize(local_230->texture);
          local_48c[0] = fVar10 / (float)((ulong)local_494 & 0xffffffff);
          pVVar8 = sf::Transformable::getPosition(&local_480);
          fVar10 = pVVar8->y;
          in_stack_fffffffffffffb60 = sf::Texture::getSize(local_230->texture);
          local_498 = ((float)local_18.y - fVar10) /
                      (float)((ulong)in_stack_fffffffffffffb60 >> 0x20);
          pfVar9 = std::min<float>(local_48c,&local_498);
          in_stack_fffffffffffffb5c = *pfVar9;
          sf::Transformable::setScale
                    (&local_480,in_stack_fffffffffffffb5c,in_stack_fffffffffffffb5c);
          sf::RenderTarget::draw
                    ((RenderTarget *)in_stack_fffffffffffffb60,
                     (Drawable *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                     in_RDI);
          sf::Sprite::~Sprite((Sprite *)in_stack_fffffffffffffa80);
        }
      }
      std::vector<sf::Text,_std::allocator<sf::Text>_>::operator[]
                ((vector<sf::Text,_std::allocator<sf::Text>_> *)((in_RDI->transform).m_matrix + 0xc)
                 ,0);
      sf::RenderTarget::draw
                ((RenderTarget *)in_stack_fffffffffffffb60,
                 (Drawable *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),in_RDI);
      sf::RenderTarget::draw
                ((RenderTarget *)in_stack_fffffffffffffb60,
                 (Drawable *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),in_RDI);
      sf::Text::~Text(local_10);
    }
  }
  return;
}

Assistant:

void DebugScreen::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!visible_) {
        return;
    }

    sf::Vector2i clippedSize = {
        std::max(static_cast<int>(windowSize_.x) - borderTopLeft_.x - borderBottomRight_.x, 0),
        std::max(static_cast<int>(windowSize_.y) - borderTopLeft_.y - borderBottomRight_.y, 0),
    };
    states.transform.translate(static_cast<sf::Vector2f>(borderTopLeft_));

    if (mode_ == Mode::def) {
        for (const auto& field : fields_) {
            target.draw(field, states);
        }
        for (const auto& custom : customFields_) {
            target.draw(custom.second, states);
        }
    } else if (mode_ == Mode::textures) {
        sf::Text textureField("Texture: none", font_, characterSize_);
        textureField.setPosition(fields_[0].getPosition() + sf::Vector2f(0.0f, 1.0f * characterSize_));
        if (modeStates_[static_cast<int>(mode_)] >= 0 && modeStates_[static_cast<int>(mode_)] < static_cast<int>(textures_.size())) {
            const NamedTexture& namedTex = textures_[modeStates_[static_cast<int>(mode_)]];
            textureField.setString("Texture: " + namedTex.name + " (size " + std::to_string(namedTex.texture->getSize().x) + " by " + std::to_string(namedTex.texture->getSize().y) + ")");

            sf::Sprite sprite(*namedTex.texture);
            sprite.setPosition(0.0f, textureField.getPosition().y + 1.0f * characterSize_ + 4.0f);
            float scaleX = (clippedSize.x - sprite.getPosition().x) / namedTex.texture->getSize().x;
            float scaleY = (clippedSize.y - sprite.getPosition().y) / namedTex.texture->getSize().y;
            float scale = std::min(scaleX, scaleY);
            sprite.setScale(scale, scale);
            target.draw(sprite, states);
        }

        target.draw(fields_[0], states);
        target.draw(textureField, states);
    }
}